

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Value * json_parse_string_with_comments(char *string)

{
  size_t __n;
  char *string_00;
  JSON_Value *pJVar1;
  char *string_mutable_copy_ptr;
  char *local_20;
  
  local_20 = (char *)0x0;
  __n = strlen(string);
  string_00 = (char *)(*parson_malloc)(__n + 1);
  if (string_00 == (char *)0x0) {
    string_00 = (char *)0x0;
  }
  else {
    string_00[__n] = '\0';
    memcpy(string_00,string,__n);
  }
  if (string_00 == (char *)0x0) {
    pJVar1 = (JSON_Value *)0x0;
  }
  else {
    remove_comments(string_00,"/*","*/");
    remove_comments(string_00,"//","\n");
    local_20 = string_00;
    pJVar1 = parse_value(&local_20,0);
    (*parson_free)(string_00);
  }
  return pJVar1;
}

Assistant:

JSON_Value * json_parse_string_with_comments(const char *string) {
    JSON_Value *result = NULL;
    char *string_mutable_copy = NULL, *string_mutable_copy_ptr = NULL;
    string_mutable_copy = parson_strdup(string);
    if (string_mutable_copy == NULL) {
        return NULL;
    }
    remove_comments(string_mutable_copy, "/*", "*/");
    remove_comments(string_mutable_copy, "//", "\n");
    string_mutable_copy_ptr = string_mutable_copy;
    result = parse_value((const char**)&string_mutable_copy_ptr, 0);
    parson_free(string_mutable_copy);
    return result;
}